

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Message *pMVar2;
  Int32 *value;
  Int32 result;
  string env_var;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStackY_68;
  Int32 in_stack_ffffffffffffffa0;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  FlagToEnvVar_abi_cxx11_((char *)CONCAT44(default_value,in_stack_ffffffffffffffa0));
  str = getenv(local_38._M_dataplus._M_p);
  if (str != (char *)0x0) {
    Message::Message((Message *)&local_58);
    pMVar2 = Message::operator<<((Message *)&local_58,(char (*) [22])"Environment variable ");
    pMVar2 = Message::operator<<(pMVar2,&local_38);
    value = (Int32 *)&stack0xffffffffffffffa0;
    bVar1 = ParseInt32(pMVar2,str,value);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
    if (!bVar1) {
      Message::Message((Message *)&sStackY_68);
      value = (Int32 *)&stack0xffffffffffffffa4;
      pMVar2 = Message::operator<<((Message *)&sStackY_68,value);
      Message::GetString_abi_cxx11_(&local_58,pMVar2);
      printf("The default value %s is used.\n",local_58._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_58);
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&sStackY_68);
      fflush(_stdout);
    }
    default_value = *value;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return default_value;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}